

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_BrepTrim::Read(ON_BrepTrim *this,ON_BinaryArchive *file)

{
  ON_Interval domain;
  ON_Interval domain_00;
  ON_Interval domain_01;
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ON_Interval OVar5;
  uint local_6c;
  ON_Interval local_68;
  ON_3dPoint P [2];
  
  bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_trim_index);
  if ((bVar2) && (bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_c2i), bVar2)) {
    ON_Interval::ON_Interval((ON_Interval *)P);
    bVar2 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)P);
    if (!bVar2) goto LAB_0042c9dc;
    OVar5.m_t[0]._1_7_ = P[0].x._1_7_;
    OVar5.m_t[0]._0_1_ = P[0].x._0_1_;
    OVar5.m_t[1] = P[0].y;
    ON_CurveProxy::SetProxyCurveDomain(&this->super_ON_CurveProxy,OVar5);
    domain_01.m_t[0]._1_7_ = P[0].x._1_7_;
    domain_01.m_t[0]._0_1_ = P[0].x._0_1_;
    domain_01.m_t[1] = P[0].y;
    ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,domain_01);
    bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_ei);
    if ((!bVar2) || (bVar2 = ON_BinaryArchive::ReadInt(file,2,this->m_vi), !bVar2))
    goto LAB_0042c9dc;
    local_6c = (uint)this->m_bRev3d;
    bVar2 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
    if (!bVar2) goto LAB_0042c9dc;
    this->m_bRev3d = local_6c != 0;
    local_6c = 0;
    bVar2 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
    switch(local_6c) {
    case 0:
      this->m_type = unknown;
      break;
    case 1:
      this->m_type = boundary;
      break;
    case 2:
      this->m_type = mated;
      break;
    case 3:
      this->m_type = seam;
      break;
    case 4:
      this->m_type = singular;
    }
    local_6c = 0;
    if (!bVar2) goto LAB_0042c9e5;
    bVar2 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
    switch(local_6c) {
    case 0:
      this->m_iso = not_iso;
      break;
    case 1:
      this->m_iso = x_iso;
      break;
    case 2:
      this->m_iso = y_iso;
      break;
    case 3:
      this->m_iso = W_iso;
      break;
    case 4:
      this->m_iso = S_iso;
      break;
    case 5:
      this->m_iso = E_iso;
      break;
    case 6:
      this->m_iso = N_iso;
    }
    if ((!bVar2) || (bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_li), !bVar2))
    goto LAB_0042c9e9;
    bVar2 = ON_BinaryArchive::ReadDouble(file,2,this->m_tolerance);
  }
  else {
LAB_0042c9dc:
    this->m_type = unknown;
LAB_0042c9e5:
    local_6c = 0;
    this->m_iso = not_iso;
LAB_0042c9e9:
    bVar2 = false;
  }
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  if ((iVar3 < 3) || (uVar4 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), uVar4 < 0xbeee764)) {
    if (bVar2 == false) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadPoint(file,P);
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadPoint(file,P + 1);
joined_r0x0042caca:
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m__legacy_2d_tol);
    if (!bVar2) {
      return false;
    }
    bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m__legacy_3d_tol);
    return bVar2;
  }
  OVar5 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
  local_68.m_t[1] = OVar5.m_t[1];
  local_68.m_t[0] = OVar5.m_t[0];
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::ReadInterval(file,&local_68);
    if (bVar2) {
      P[0].x._0_1_ = '\0';
      P[0].x._1_7_ = 0;
      P[0].y = 0.0;
      P[0].z = 0.0;
      bVar2 = ON_BinaryArchive::ReadChar(file,8,(ON__UINT8 *)P);
      cVar1 = P[0].x._0_1_;
      if (bVar2) {
        bVar2 = ON_BinaryArchive::ReadChar(file,0x18,(ON__UINT8 *)P);
        if (cVar1 == '\x01') {
          ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
        }
        domain.m_t[1] = local_68.m_t[1];
        domain.m_t[0] = local_68.m_t[0];
        ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,domain);
        goto joined_r0x0042caca;
      }
      goto LAB_0042cb15;
    }
    OVar5 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
    local_68.m_t[1] = OVar5.m_t[1];
    local_68.m_t[0] = OVar5.m_t[0];
  }
  P[0].x._0_1_ = '\0';
  P[0].x._1_7_ = 0;
  P[0].y = 0.0;
  P[0].z = 0.0;
LAB_0042cb15:
  domain_00.m_t[1] = local_68.m_t[1];
  domain_00.m_t[0] = local_68.m_t[0];
  ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,domain_00);
  return false;
}

Assistant:

bool ON_BrepTrim::Read( ON_BinaryArchive& file )
{
  ON_3dPoint P[2];
  int i;
  bool rc = file.ReadInt( &m_trim_index );
  if ( rc )
    rc = file.ReadInt( &m_c2i );
  if ( rc )
  {
    ON_Interval d;
    rc = file.ReadInterval( d );
    if (rc)
    {
      SetProxyCurveDomain(d);
      SetDomain(d);
    }
  }
  if ( rc )
    rc = file.ReadInt( &m_ei );
  if ( rc )
    rc = file.ReadInt( 2, m_vi );
  if ( rc )
  {
    i = m_bRev3d;
    rc = file.ReadInt( &i );
    if (rc)
      m_bRev3d = (i!=0);
  }

  i = unknown;
  if ( rc )
    rc = file.ReadInt( &i );
  switch (i) {
  case unknown:
    m_type = unknown;
    break;
  case boundary:
    m_type = boundary;
    break;
  case mated:
    m_type = mated;
    break;
  case seam:
    m_type = seam;
    break;
  case singular:
    m_type = singular;
    break;
  }

  i = ON_Surface::not_iso;
  if ( rc )
    rc = file.ReadInt( &i );
  switch(i) {
  case ON_Surface::not_iso:
    m_iso = ON_Surface::not_iso;
    break;
  case ON_Surface::x_iso:
    m_iso = ON_Surface::x_iso;
    break;
  case ON_Surface::y_iso:
    m_iso = ON_Surface::y_iso;
    break;
  case ON_Surface::W_iso:
    m_iso = ON_Surface::W_iso;
    break;
  case ON_Surface::S_iso:
    m_iso = ON_Surface::S_iso;
    break;
  case ON_Surface::E_iso:
    m_iso = ON_Surface::E_iso;
    break;
  case ON_Surface::N_iso:
    m_iso = ON_Surface::N_iso;
    break;
  }

  if ( rc )
    rc = file.ReadInt( &m_li );
  if ( rc )
    rc = file.ReadDouble( 2, m_tolerance );
  if ( file.Archive3dmVersion() >= 3 && file.ArchiveOpenNURBSVersion() >= 200206180 )
  {
    // read trim proxy curve information added in version 200206180
    ON_Interval d = ProxyCurveDomain();
    if (rc )
    {
      rc = file.ReadInterval( d );
      if ( !rc )
        d = ProxyCurveDomain();
    }
    unsigned char b[24];
    memset(b,0,sizeof(b));
    bool bProxyCurveIsReversed = false;
    if (rc)
    {
      rc = file.ReadChar(8,b);
      if (rc && b[0] == 1 )
        bProxyCurveIsReversed = true;
    }
    if (rc)
      rc = file.ReadChar(24,b);

    if ( bProxyCurveIsReversed )
      ON_CurveProxy::Reverse();
    SetDomain(d);
  }
  else
  {
    if ( rc )
      rc = file.ReadPoint( P[0] ); //m_P[0] );
    if ( rc )
      rc = file.ReadPoint( P[1] ); //m_P[1] );
  }
  if ( rc )
    rc = file.ReadDouble( &m__legacy_2d_tol );
  if ( rc )
    rc = file.ReadDouble( &m__legacy_3d_tol );
  return rc;
}